

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

Dic<asl::String> __thiscall asl::String::split(String *this,String *sep1,String *sep2)

{
  String *__return_storage_ptr__;
  int j;
  String *this_00;
  String *in_RCX;
  long lVar1;
  long lVar2;
  Array<asl::String> pairs;
  undefined1 local_70 [40];
  String local_48;
  
  local_70._8_8_ = this;
  Array<asl::Map<asl::String,_asl::String>::KeyVal>::Array
            ((Array<asl::Map<asl::String,_asl::String>::KeyVal> *)this);
  split((String *)local_70,sep1);
  lVar2 = 0;
  __return_storage_ptr__ = (String *)(local_70 + 0x10);
  for (lVar1 = 0; lVar1 < *(int *)&((String *)(local_70._0_8_ + -0x18))->field_2; lVar1 = lVar1 + 1)
  {
    j = indexOf((String *)((long)(int *)local_70._0_8_ + lVar2),in_RCX,0);
    if (0 < j) {
      substring(&local_48,(String *)((long)(int *)local_70._0_8_ + lVar2),in_RCX->_len + j);
      substring(__return_storage_ptr__,(String *)((long)(int *)local_70._0_8_ + lVar2),0,j);
      this_00 = Map<asl::String,_asl::String>::operator[]
                          ((Map<asl::String,_asl::String> *)local_70._8_8_,__return_storage_ptr__);
      operator=(this_00,&local_48);
      ~String(__return_storage_ptr__);
      ~String(&local_48);
    }
    lVar2 = lVar2 + 0x18;
  }
  Array<asl::String>::~Array((Array<asl::String> *)local_70);
  return (Dic<asl::String>)(KeyVal *)local_70._8_8_;
}

Assistant:

Dic<String> String::split(const String& sep1, const String& sep2) const
{
	Dic<String> dic;
	Array<String> pairs = split(sep1);
	for (int i = 0; i < pairs.length(); i++)
	{
		int j = pairs[i].indexOf(sep2);
		if (j > 0)
			dic[pairs[i].substring(0, j)] = pairs[i].substring(j + sep2.length());
	}
	return dic;
}